

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cluster_linearize_tests.cpp
# Opt level: O2

void __thiscall cluster_linearize_tests::depgraph_ser_tests::test_method(depgraph_ser_tests *this)

{
  uint uVar1;
  long in_FS_OFFSET;
  initializer_list<std::pair<FeeFrac,_bitset_detail::IntBitSet<unsigned_int>_>_> __l;
  initializer_list<unsigned_int> ilist;
  initializer_list<std::pair<FeeFrac,_bitset_detail::IntBitSet<unsigned_int>_>_> __l_00;
  initializer_list<unsigned_int> ilist_00;
  initializer_list<std::pair<FeeFrac,_bitset_detail::IntBitSet<unsigned_int>_>_> __l_01;
  initializer_list<unsigned_int> ilist_01;
  initializer_list<unsigned_int> ilist_02;
  initializer_list<unsigned_int> ilist_03;
  initializer_list<std::pair<FeeFrac,_bitset_detail::IntBitSet<unsigned_int>_>_> __l_02;
  initializer_list<unsigned_int> ilist_04;
  initializer_list<unsigned_int> ilist_05;
  initializer_list<unsigned_int> ilist_06;
  initializer_list<std::pair<FeeFrac,_bitset_detail::IntBitSet<unsigned_int>_>_> __l_03;
  allocator<char> local_fe;
  allocator_type local_fd;
  IntBitSet<unsigned_int> local_fc;
  IntBitSet<unsigned_int> local_f8;
  uint local_f4;
  uint local_f0;
  IntBitSet<unsigned_int> local_ec;
  string local_e8;
  undefined4 local_c8;
  uint local_c0;
  undefined8 local_b8;
  uint local_b0;
  uint local_a8;
  undefined8 local_a0;
  uint local_98;
  uint local_90;
  undefined8 local_88;
  uint local_80;
  uint local_78;
  undefined8 local_70;
  string local_68;
  pair<FeeFrac,_bitset_detail::IntBitSet<unsigned_int>_> local_40;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_68._M_dataplus._M_p = (pointer)0x0;
  local_68._M_string_length = 0;
  local_68.field_2._M_allocated_capacity = 0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e8,"00",(allocator<char> *)&local_40);
  (anonymous_namespace)::TestDepGraphSerialization<bitset_detail::IntBitSet<unsigned_int>>
            ((Cluster<bitset_detail::IntBitSet<unsigned_int>_> *)&local_68,&local_e8);
  std::__cxx11::string::~string((string *)&local_e8);
  std::
  _Vector_base<std::pair<FeeFrac,_bitset_detail::IntBitSet<unsigned_int>_>,_std::allocator<std::pair<FeeFrac,_bitset_detail::IntBitSet<unsigned_int>_>_>_>
  ::~_Vector_base((_Vector_base<std::pair<FeeFrac,_bitset_detail::IntBitSet<unsigned_int>_>,_std::allocator<std::pair<FeeFrac,_bitset_detail::IntBitSet<unsigned_int>_>_>_>
                   *)&local_68);
  local_40.first.fee = 0;
  local_40.first.size = 1;
  local_40.second.m_val = 0;
  __l._M_len = 1;
  __l._M_array = &local_40;
  std::
  vector<std::pair<FeeFrac,_bitset_detail::IntBitSet<unsigned_int>_>,_std::allocator<std::pair<FeeFrac,_bitset_detail::IntBitSet<unsigned_int>_>_>_>
  ::vector((vector<std::pair<FeeFrac,_bitset_detail::IntBitSet<unsigned_int>_>,_std::allocator<std::pair<FeeFrac,_bitset_detail::IntBitSet<unsigned_int>_>_>_>
            *)&local_68,__l,(allocator_type *)&local_70);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e8,"01000000",(allocator<char> *)&local_ec);
  (anonymous_namespace)::TestDepGraphSerialization<bitset_detail::IntBitSet<unsigned_int>>
            ((Cluster<bitset_detail::IntBitSet<unsigned_int>_> *)&local_68,&local_e8);
  std::__cxx11::string::~string((string *)&local_e8);
  std::
  _Vector_base<std::pair<FeeFrac,_bitset_detail::IntBitSet<unsigned_int>_>,_std::allocator<std::pair<FeeFrac,_bitset_detail::IntBitSet<unsigned_int>_>_>_>
  ::~_Vector_base((_Vector_base<std::pair<FeeFrac,_bitset_detail::IntBitSet<unsigned_int>_>,_std::allocator<std::pair<FeeFrac,_bitset_detail::IntBitSet<unsigned_int>_>_>_>
                   *)&local_68);
  local_e8._M_dataplus._M_p = (pointer)0x2a;
  local_e8._M_string_length._0_4_ = 0xb;
  local_e8.field_2._M_allocated_capacity._0_4_ = 0;
  local_ec.m_val = 0;
  ilist._M_len = 1;
  ilist._M_array = &local_ec.m_val;
  bitset_detail::IntBitSet<unsigned_int>::IntBitSet((IntBitSet<unsigned_int> *)&local_70,ilist);
  local_e8.field_2._8_8_ = 0xfffffffffffffff3;
  local_c8 = 7;
  local_c0 = local_70._0_4_;
  __l_00._M_len = 2;
  __l_00._M_array = (iterator)&local_e8;
  std::
  vector<std::pair<FeeFrac,_bitset_detail::IntBitSet<unsigned_int>_>,_std::allocator<std::pair<FeeFrac,_bitset_detail::IntBitSet<unsigned_int>_>_>_>
  ::vector((vector<std::pair<FeeFrac,_bitset_detail::IntBitSet<unsigned_int>_>,_std::allocator<std::pair<FeeFrac,_bitset_detail::IntBitSet<unsigned_int>_>_>_>
            *)&local_40,__l_00,(allocator_type *)&local_f8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_68,"0b54000719000000",(allocator<char> *)&local_f0);
  (anonymous_namespace)::TestDepGraphSerialization<bitset_detail::IntBitSet<unsigned_int>>
            ((Cluster<bitset_detail::IntBitSet<unsigned_int>_> *)&local_40,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  std::
  _Vector_base<std::pair<FeeFrac,_bitset_detail::IntBitSet<unsigned_int>_>,_std::allocator<std::pair<FeeFrac,_bitset_detail::IntBitSet<unsigned_int>_>_>_>
  ::~_Vector_base((_Vector_base<std::pair<FeeFrac,_bitset_detail::IntBitSet<unsigned_int>_>,_std::allocator<std::pair<FeeFrac,_bitset_detail::IntBitSet<unsigned_int>_>_>_>
                   *)&local_40);
  local_e8._M_dataplus._M_p = (pointer)0x40;
  local_e8._M_string_length._0_4_ = 0x80;
  local_e8.field_2._M_allocated_capacity._0_4_ = 0;
  local_e8.field_2._8_8_ = 0x80;
  local_c8 = 0x100;
  local_c0 = 0;
  local_70 = 0x100000000;
  ilist_00._M_len = 2;
  ilist_00._M_array = (iterator)&local_70;
  bitset_detail::IntBitSet<unsigned_int>::IntBitSet(&local_ec,ilist_00);
  local_b8 = 1;
  local_b0 = 1;
  local_a8 = local_ec.m_val;
  __l_01._M_len = 3;
  __l_01._M_array = (iterator)&local_e8;
  std::
  vector<std::pair<FeeFrac,_bitset_detail::IntBitSet<unsigned_int>_>,_std::allocator<std::pair<FeeFrac,_bitset_detail::IntBitSet<unsigned_int>_>_>_>
  ::vector((vector<std::pair<FeeFrac,_bitset_detail::IntBitSet<unsigned_int>_>,_std::allocator<std::pair<FeeFrac,_bitset_detail::IntBitSet<unsigned_int>_>_>_>
            *)&local_40,__l_01,(allocator_type *)&local_f8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_68,"80008000008100810001010200000000",(allocator<char> *)&local_f0);
  (anonymous_namespace)::TestDepGraphSerialization<bitset_detail::IntBitSet<unsigned_int>>
            ((Cluster<bitset_detail::IntBitSet<unsigned_int>_> *)&local_40,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  std::
  _Vector_base<std::pair<FeeFrac,_bitset_detail::IntBitSet<unsigned_int>_>,_std::allocator<std::pair<FeeFrac,_bitset_detail::IntBitSet<unsigned_int>_>_>_>
  ::~_Vector_base((_Vector_base<std::pair<FeeFrac,_bitset_detail::IntBitSet<unsigned_int>_>,_std::allocator<std::pair<FeeFrac,_bitset_detail::IntBitSet<unsigned_int>_>_>_>
                   *)&local_40);
  uVar1 = 1;
  ilist_01._M_len = 1;
  ilist_01._M_array = &local_ec.m_val;
  local_ec.m_val = uVar1;
  bitset_detail::IntBitSet<unsigned_int>::IntBitSet((IntBitSet<unsigned_int> *)&local_70,ilist_01);
  local_e8._M_dataplus._M_p = (pointer)0x39;
  local_e8._M_string_length._0_4_ = 0x72;
  local_e8.field_2._M_allocated_capacity._0_4_ = local_70._0_4_;
  local_e8.field_2._8_8_ = 0xffffffffffffffc7;
  local_c8 = 0x71;
  local_c0 = 0;
  ilist_02._M_len = 1;
  ilist_02._M_array = &local_f0;
  local_f0 = uVar1;
  bitset_detail::IntBitSet<unsigned_int>::IntBitSet(&local_f8,ilist_02);
  local_b8 = 0xffffffffffffffc6;
  local_b0 = 0x73;
  local_a8 = local_f8.m_val;
  local_f4 = 2;
  ilist_03._M_len = 1;
  ilist_03._M_array = &local_f4;
  bitset_detail::IntBitSet<unsigned_int>::IntBitSet(&local_fc,ilist_03);
  local_a0 = 0x3a;
  local_98 = 0x74;
  local_90 = local_fc.m_val;
  __l_02._M_len = 4;
  __l_02._M_array = (iterator)&local_e8;
  std::
  vector<std::pair<FeeFrac,_bitset_detail::IntBitSet<unsigned_int>_>,_std::allocator<std::pair<FeeFrac,_bitset_detail::IntBitSet<unsigned_int>_>_>_>
  ::vector((vector<std::pair<FeeFrac,_bitset_detail::IntBitSet<unsigned_int>_>,_std::allocator<std::pair<FeeFrac,_bitset_detail::IntBitSet<unsigned_int>_>_>_>
            *)&local_40,__l_02,&local_fd);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_68,"71710072720001737301007474000100",&local_fe);
  (anonymous_namespace)::TestDepGraphSerialization<bitset_detail::IntBitSet<unsigned_int>>
            ((Cluster<bitset_detail::IntBitSet<unsigned_int>_> *)&local_40,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  std::
  _Vector_base<std::pair<FeeFrac,_bitset_detail::IntBitSet<unsigned_int>_>,_std::allocator<std::pair<FeeFrac,_bitset_detail::IntBitSet<unsigned_int>_>_>_>
  ::~_Vector_base((_Vector_base<std::pair<FeeFrac,_bitset_detail::IntBitSet<unsigned_int>_>,_std::allocator<std::pair<FeeFrac,_bitset_detail::IntBitSet<unsigned_int>_>_>_>
                   *)&local_40);
  local_70 = 0x200000001;
  ilist_04._M_len = 2;
  ilist_04._M_array = (iterator)&local_70;
  bitset_detail::IntBitSet<unsigned_int>::IntBitSet(&local_ec,ilist_04);
  local_e8._M_dataplus._M_p = &DAT_00000001;
  local_e8._M_string_length._0_4_ = 3;
  local_e8.field_2._M_allocated_capacity._0_4_ = local_ec.m_val;
  local_e8.field_2._8_8_ = 1;
  local_c8 = 2;
  local_c0 = 0;
  local_b8 = 3;
  local_a8 = 0;
  local_f0 = 0;
  ilist_05._M_len = 1;
  ilist_05._M_array = &local_f0;
  local_b0 = uVar1;
  bitset_detail::IntBitSet<unsigned_int>::IntBitSet(&local_f8,ilist_05);
  local_a0 = 1;
  local_90 = local_f8.m_val;
  ilist_06._M_len = 1;
  ilist_06._M_array = &local_f4;
  local_f4 = uVar1;
  local_98 = uVar1;
  bitset_detail::IntBitSet<unsigned_int>::IntBitSet(&local_fc,ilist_06);
  local_88 = 2;
  local_78 = local_fc.m_val;
  __l_03._M_len = 5;
  __l_03._M_array = (iterator)&local_e8;
  local_80 = uVar1;
  std::
  vector<std::pair<FeeFrac,_bitset_detail::IntBitSet<unsigned_int>_>,_std::allocator<std::pair<FeeFrac,_bitset_detail::IntBitSet<unsigned_int>_>_>_>
  ::vector((vector<std::pair<FeeFrac,_bitset_detail::IntBitSet<unsigned_int>_>,_std::allocator<std::pair<FeeFrac,_bitset_detail::IntBitSet<unsigned_int>_>_>_>
            *)&local_40,__l_03,&local_fd);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_68,"0202000106010104010003020100030102000200",&local_fe);
  (anonymous_namespace)::TestDepGraphSerialization<bitset_detail::IntBitSet<unsigned_int>>
            ((Cluster<bitset_detail::IntBitSet<unsigned_int>_> *)&local_40,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  std::
  _Vector_base<std::pair<FeeFrac,_bitset_detail::IntBitSet<unsigned_int>_>,_std::allocator<std::pair<FeeFrac,_bitset_detail::IntBitSet<unsigned_int>_>_>_>
  ::~_Vector_base((_Vector_base<std::pair<FeeFrac,_bitset_detail::IntBitSet<unsigned_int>_>,_std::allocator<std::pair<FeeFrac,_bitset_detail::IntBitSet<unsigned_int>_>_>_>
                   *)&local_40);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(depgraph_ser_tests)
{
    // Empty cluster.
    TestDepGraphSerialization<TestBitSet>(
        {},
        "00" /* end of graph */);

    // Transactions: A(fee=0,size=1).
    TestDepGraphSerialization<TestBitSet>(
        {{{0, 1}, {}}},
        "01" /* A size */
        "00" /* A fee */
        "00" /* A insertion position (no skips): A */
        "00" /* end of graph */);

    // Transactions: A(fee=42,size=11), B(fee=-13,size=7), B depends on A.
    TestDepGraphSerialization<TestBitSet>(
        {{{42, 11}, {}}, {{-13, 7}, {0}}},
        "0b" /* A size */
        "54" /* A fee */
        "00" /* A insertion position (no skips): A */
        "07" /* B size */
        "19" /* B fee */
        "00" /* B->A dependency (no skips) */
        "00" /* B insertion position (no skips): A,B */
        "00" /* end of graph */);

    // Transactions: A(64,128), B(128,256), C(1,1), C depends on A and B.
    TestDepGraphSerialization<TestBitSet>(
        {{{64, 128}, {}}, {{128, 256}, {}}, {{1, 1}, {0, 1}}},
        "8000" /* A size */
        "8000" /* A fee */
        "00"   /* A insertion position (no skips): A */
        "8100" /* B size */
        "8100" /* B fee */
        "01"   /* B insertion position (skip B->A dependency): A,B */
        "01"   /* C size */
        "02"   /* C fee */
        "00"   /* C->B dependency (no skips) */
        "00"   /* C->A dependency (no skips) */
        "00"   /* C insertion position (no skips): A,B,C */
        "00"   /* end of graph */);

    // Transactions: A(-57,113), B(57,114), C(-58,115), D(58,116). Deps: B->A, C->A, D->C, in order
    // [B,A,C,D]. This exercises non-topological ordering (internally serialized as A,B,C,D).
    TestDepGraphSerialization<TestBitSet>(
        {{{57, 114}, {1}}, {{-57, 113}, {}}, {{-58, 115}, {1}}, {{58, 116}, {2}}},
        "71" /* A size */
        "71" /* A fee */
        "00" /* A insertion position (no skips): A */
        "72" /* B size */
        "72" /* B fee */
        "00" /* B->A dependency (no skips) */
        "01" /* B insertion position (skip A): B,A */
        "73" /* C size */
        "73" /* C fee */
        "01" /* C->A dependency (skip C->B dependency) */
        "00" /* C insertion position (no skips): B,A,C */
        "74" /* D size */
        "74" /* D fee */
        "00" /* D->C dependency (no skips) */
        "01" /* D insertion position (skip D->B dependency, D->A is implied): B,A,C,D */
        "00" /* end of graph */);

    // Transactions: A(1,2), B(3,1), C(2,1), D(1,3), E(1,1). Deps: C->A, D->A, D->B, E->D.
    // In order: [D,A,B,E,C]. Internally serialized in order A,B,C,D,E.
    TestDepGraphSerialization<TestBitSet>(
        {{{1, 3}, {1, 2}}, {{1, 2}, {}}, {{3, 1}, {}}, {{1, 1}, {0}}, {{2, 1}, {1}}},
        "02" /* A size */
        "02" /* A fee */
        "00" /* A insertion position (no skips): A */
        "01" /* B size */
        "06" /* B fee */
        "01" /* B insertion position (skip B->A dependency): A,B */
        "01" /* C size */
        "04" /* C fee */
        "01" /* C->A dependency (skip C->B dependency) */
        "00" /* C insertion position (no skips): A,B,C */
        "03" /* D size */
        "02" /* D fee */
        "01" /* D->B dependency (skip D->C dependency) */
        "00" /* D->A dependency (no skips) */
        "03" /* D insertion position (skip C,B,A): D,A,B,C */
        "01" /* E size */
        "02" /* E fee */
        "00" /* E->D dependency (no skips) */
        "02" /* E insertion position (skip E->C dependency, E->B and E->A are implied,
                skip insertion C): D,A,B,E,C */
        "00" /* end of graph */
    );
}